

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O1

string * RankSerialize(string *__return_storage_ptr__,
                      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL>
                      *list)

{
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL>
  *paVar1;
  pointer pcVar2;
  value_type rank;
  long *local_58 [2];
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  paVar1 = list + 1;
  do {
    pcVar2 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &list->_M_elems[0]._M_dataplus)->_M_dataplus)._M_p;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar2,pcVar2 + list->_M_elems[0]._M_string_length);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    list = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL>
            *)((long)list + 0x20);
  } while (list != paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string RankSerialize(std::array<std::string, 9> list)
{
	std::string serialized;

	UTIL_FOREACH(list, rank)
	{
		serialized.append(rank);
		serialized.append(",");
	}

	return serialized;
}